

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_unittest.cc
# Opt level: O2

void Test_DeathSTREQ_logging::RunTest(void)

{
  undefined *puVar1;
  int iVar2;
  string *psVar3;
  ostream *poVar4;
  char *pcVar5;
  allocator<char> local_a1;
  LogMessage local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  puVar1 = google::g_logging_fail_func;
  google::g_called_abort = '\0';
  google::g_logging_fail_func = google::CalledAbort;
  iVar2 = _setjmp((__jmp_buf_tag *)google::g_jmp_buf);
  if (iVar2 == 0) {
    psVar3 = google::CheckstrcmptrueImpl_abi_cxx11_((char *)0x0,"this","nullptr == \"this\"");
    if (psVar3 != (string *)0x0) {
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_a0,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                 ,0x2ca);
      poVar4 = google::LogMessage::stream(&local_a0);
      std::operator<<(poVar4,(string *)psVar3);
      goto LAB_0010f183;
    }
  }
  if (google::g_called_abort == '\0') {
    pcVar5 = "CHECK_STREQ(nullptr, \"this\")";
  }
  else {
    google::g_called_abort = '\0';
    google::g_logging_fail_func = google::CalledAbort;
    iVar2 = _setjmp((__jmp_buf_tag *)google::g_jmp_buf);
    if (iVar2 == 0) {
      psVar3 = google::CheckstrcmptrueImpl_abi_cxx11_("this","siht","\"this\" == \"siht\"");
      if (psVar3 != (string *)0x0) {
        google::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_a0,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                   ,0x2cb);
        poVar4 = google::LogMessage::stream(&local_a0);
        std::operator<<(poVar4,(string *)psVar3);
        goto LAB_0010f183;
      }
    }
    if (google::g_called_abort == '\0') {
      pcVar5 = "CHECK_STREQ(\"this\", \"siht\")";
      goto LAB_0010f008;
    }
    google::g_called_abort = '\0';
    google::g_logging_fail_func = google::CalledAbort;
    iVar2 = _setjmp((__jmp_buf_tag *)google::g_jmp_buf);
    if (iVar2 == 0) {
      psVar3 = google::CheckstrcasecmptrueImpl_abi_cxx11_((char *)0x0,"siht","nullptr == \"siht\"");
      if (psVar3 != (string *)0x0) {
        google::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_a0,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                   ,0x2cc);
        poVar4 = google::LogMessage::stream(&local_a0);
        std::operator<<(poVar4,(string *)psVar3);
        goto LAB_0010f183;
      }
    }
    if (google::g_called_abort == '\0') {
      pcVar5 = "CHECK_STRCASEEQ(nullptr, \"siht\")";
      goto LAB_0010f008;
    }
    google::g_called_abort = '\0';
    google::g_logging_fail_func = google::CalledAbort;
    iVar2 = _setjmp((__jmp_buf_tag *)google::g_jmp_buf);
    if (iVar2 == 0) {
      psVar3 = google::CheckstrcasecmptrueImpl_abi_cxx11_("this","siht","\"this\" == \"siht\"");
      if (psVar3 != (string *)0x0) {
        google::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_a0,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                   ,0x2cd);
        poVar4 = google::LogMessage::stream(&local_a0);
        std::operator<<(poVar4,(string *)psVar3);
        goto LAB_0010f183;
      }
    }
    if (google::g_called_abort == '\0') {
      pcVar5 = "CHECK_STRCASEEQ(\"this\", \"siht\")";
      goto LAB_0010f008;
    }
    google::g_called_abort = '\0';
    google::g_logging_fail_func = google::CalledAbort;
    iVar2 = _setjmp((__jmp_buf_tag *)google::g_jmp_buf);
    if (iVar2 == 0) {
      psVar3 = google::CheckstrcmpfalseImpl_abi_cxx11_((char *)0x0,(char *)0x0,"nullptr != nullptr")
      ;
      if (psVar3 != (string *)0x0) {
        google::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_a0,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                   ,0x2ce);
        poVar4 = google::LogMessage::stream(&local_a0);
        std::operator<<(poVar4,(string *)psVar3);
        goto LAB_0010f183;
      }
    }
    if (google::g_called_abort == '\0') {
      pcVar5 = "CHECK_STRNE(nullptr, nullptr)";
      goto LAB_0010f008;
    }
    google::g_called_abort = '\0';
    google::g_logging_fail_func = google::CalledAbort;
    iVar2 = _setjmp((__jmp_buf_tag *)google::g_jmp_buf);
    if (iVar2 == 0) {
      psVar3 = google::CheckstrcmpfalseImpl_abi_cxx11_("this","this","\"this\" != \"this\"");
      if (psVar3 != (string *)0x0) {
        google::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_a0,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                   ,0x2cf);
        poVar4 = google::LogMessage::stream(&local_a0);
        std::operator<<(poVar4,(string *)psVar3);
        goto LAB_0010f183;
      }
    }
    if (google::g_called_abort == '\0') {
      pcVar5 = "CHECK_STRNE(\"this\", \"this\")";
    }
    else {
      google::g_called_abort = '\0';
      google::g_logging_fail_func = google::CalledAbort;
      iVar2 = _setjmp((__jmp_buf_tag *)google::g_jmp_buf);
      if (iVar2 == 0) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"a",&local_a1);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_a0,&local_40,"b");
        psVar3 = google::CheckstrcmptrueImpl_abi_cxx11_
                           ((char *)local_a0.allocated_,"abc",
                            "(string(\"a\") + \"b\").c_str() == \"abc\"");
        std::__cxx11::string::~string((string *)&local_a0);
        std::__cxx11::string::~string((string *)&local_40);
        if (psVar3 != (string *)0x0) {
          google::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_a0,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                     ,0x2d0);
          poVar4 = google::LogMessage::stream(&local_a0);
          std::operator<<(poVar4,(string *)psVar3);
LAB_0010f183:
          google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_a0);
        }
      }
      google::g_logging_fail_func = puVar1;
      if (google::g_called_abort != '\0') {
        return;
      }
      pcVar5 = "CHECK_STREQ((string(\"a\") + \"b\").c_str(), \"abc\")";
    }
  }
LAB_0010f008:
  google::g_logging_fail_func = puVar1;
  fprintf(_stderr,"Function didn\'t die (%s): %s\n","",pcVar5);
  exit(1);
}

Assistant:

TEST(DeathSTREQ, logging) {
  ASSERT_DEATH(CHECK_STREQ(nullptr, "this"), "");
  ASSERT_DEATH(CHECK_STREQ("this", "siht"), "");
  ASSERT_DEATH(CHECK_STRCASEEQ(nullptr, "siht"), "");
  ASSERT_DEATH(CHECK_STRCASEEQ("this", "siht"), "");
  ASSERT_DEATH(CHECK_STRNE(nullptr, nullptr), "");
  ASSERT_DEATH(CHECK_STRNE("this", "this"), "");
  ASSERT_DEATH(CHECK_STREQ((string("a") + "b").c_str(), "abc"), "");
}